

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_noise_table.c
# Opt level: O2

void GenerateLumaGrainBlock
               (RK_S32 (*luma_grain_block) [82],RK_S32 bitdepth,RK_U8 num_y_points,
               RK_S32 grain_scale_shift,RK_S32 ar_coeff_lag,RK_S32 *ar_coeffs_y,
               RK_S32 ar_coeff_shift,RK_S32 grain_min,RK_S32 grain_max,RK_U16 random_seed)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  RK_S32 a;
  RK_S32 RVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  RK_S32 deltaRow;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  RK_U16 grain_random_register;
  int local_48;
  int local_44;
  RK_S32 (*local_40) [82];
  long local_38;
  
  cVar1 = (char)grain_scale_shift - (char)bitdepth;
  local_48 = 1;
  grain_random_register = random_seed;
  local_44 = ar_coeff_lag;
  local_40 = luma_grain_block;
  for (local_38 = 0; local_38 != 0x49; local_38 = local_38 + 1) {
    for (lVar11 = 0; lVar11 != 0x52; lVar11 = lVar11 + 1) {
      if (num_y_points == '\0') {
        iVar2 = 0;
      }
      else {
        UpdateRandomRegister(&grain_random_register);
        iVar2 = gaussian_sequence[grain_random_register >> 5] + (1 << (cVar1 + 0xbU & 0x1f)) >>
                (cVar1 + 0xcU & 0x1f);
      }
      (*luma_grain_block)[lVar11] = iVar2;
    }
    luma_grain_block = luma_grain_block + 1;
  }
  lVar4 = (long)-local_44;
  piVar6 = (int *)((long)local_40 + lVar4 * 0x14c + 0x3e4);
  for (lVar11 = 3; piVar7 = piVar6, lVar8 = 3, lVar11 != 0x49; lVar11 = lVar11 + 1) {
    for (; lVar8 != 0x4f; lVar8 = lVar8 + 1) {
      lVar3 = 0;
      iVar2 = 0;
      piVar9 = piVar7;
      for (lVar10 = lVar4; lVar10 < 1; lVar10 = lVar10 + 1) {
        lVar3 = (long)(int)lVar3;
        piVar12 = piVar9;
        for (lVar13 = lVar4; (lVar13 <= local_44 && ((int)lVar13 != 0 || (int)lVar10 != 0));
            lVar13 = lVar13 + 1) {
          iVar2 = iVar2 + *piVar12 * ar_coeffs_y[lVar3];
          lVar3 = lVar3 + 1;
          piVar12 = piVar12 + 1;
        }
        piVar9 = piVar9 + 0x52;
      }
      iVar2 = (iVar2 + (local_48 << ((byte)ar_coeff_shift - 1 & 0x1f)) >>
              ((byte)ar_coeff_shift & 0x1f)) + local_40[lVar11][lVar8];
      RVar5 = grain_max;
      if (iVar2 < grain_max) {
        RVar5 = iVar2;
      }
      if (iVar2 < grain_min) {
        RVar5 = grain_min;
      }
      local_40[lVar11][lVar8] = RVar5;
      piVar7 = piVar7 + 1;
    }
    piVar6 = piVar6 + 0x52;
  }
  return;
}

Assistant:

void GenerateLumaGrainBlock(RK_S32 luma_grain_block[][82], RK_S32 bitdepth,
                            RK_U8 num_y_points, RK_S32 grain_scale_shift,
                            RK_S32 ar_coeff_lag, RK_S32 ar_coeffs_y[],
                            RK_S32 ar_coeff_shift, RK_S32 grain_min, RK_S32 grain_max,
                            RK_U16 random_seed)
{
    RK_S32 gauss_sec_shift = 12 - bitdepth + grain_scale_shift;
    RK_U16 grain_random_register = random_seed;
    RK_S32 i, j;
    for (i = 0; i < 73; i++) {
        for (j = 0; j < 82; j++) {
            if (num_y_points > 0) {
                UpdateRandomRegister(&grain_random_register);
                luma_grain_block[i][j] = RoundPowerOfTwo(
                                             gaussian_sequence[GetRandomNumber(grain_random_register)],
                                             gauss_sec_shift);
            } else {
                luma_grain_block[i][j] = 0;
            }
        }
    }

    for (i = 3; i < 73; i++)
        for (j = 3; j < 82 - 3; j++) {
            RK_S32 pos = 0;
            RK_S32 wsum = 0;
            RK_S32 deltaRow, deltaCol;
            for (deltaRow = -ar_coeff_lag; deltaRow <= 0; deltaRow++) {
                for (deltaCol = -ar_coeff_lag; deltaCol <= ar_coeff_lag;
                     deltaCol++) {
                    if (deltaRow == 0 && deltaCol == 0) break;
                    wsum = wsum + ar_coeffs_y[pos] *
                           luma_grain_block[i + deltaRow][j + deltaCol];
                    ++pos;
                }
            }
            luma_grain_block[i][j] =
                Clamp(luma_grain_block[i][j] + RoundPowerOfTwo(wsum, ar_coeff_shift),
                      grain_min, grain_max);
        }
}